

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_read_pcm_frames
                    (ma_decoder *pDecoder,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint64 *pFramesRead_00;
  int iVar1;
  long *pDataSource;
  ulong uVar2;
  ma_result mVar3;
  ma_result mVar4;
  ulong uVar5;
  ulong frameCount_00;
  bool bVar6;
  ma_uint32 channels;
  ma_uint64 totalFramesReadOut;
  ma_uint32 sampleRate;
  ma_uint64 requiredInputFrameCount;
  ma_format format;
  int local_106c;
  void *local_1068;
  ma_uint64 local_1060;
  ma_uint64 local_1058;
  ma_data_converter *local_1050;
  ulong local_1048;
  ulong local_1040;
  ulong local_1038 [513];
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  if (pDecoder == (ma_decoder *)0x0 || frameCount == 0) {
    return MA_INVALID_ARGS;
  }
  pDataSource = (long *)pDecoder->pBackend;
  if (pDataSource == (long *)0x0) {
    return MA_INVALID_OPERATION;
  }
  if ((pDecoder->converter).isPassthrough == '\0') {
    if ((pFramesOut != (void *)0x0) || ((pDecoder->converter).hasResampler != '\0')) {
      local_1058 = 0;
      if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
        mVar4 = MA_NOT_IMPLEMENTED;
        local_1068 = (void *)0x0;
        local_106c = 0;
      }
      else {
        local_1068 = (void *)0x0;
        mVar4 = (**(code **)(*pDataSource + 0x10))
                          (pDataSource,local_1038,&local_1060,&local_1048,0,0);
        local_106c = 0;
        if (mVar4 == MA_SUCCESS) {
          local_1068 = (void *)(local_1038[0] & 0xffffffff);
          local_106c = (int)local_1060;
          mVar4 = MA_SUCCESS;
        }
      }
      mVar3 = mVar4;
      if (mVar4 == MA_SUCCESS) {
        local_1050 = &pDecoder->converter;
        if (pDecoder->pInputCache == (void *)0x0) {
          mVar3 = MA_SUCCESS;
          if (local_1058 < frameCount) {
            iVar1 = (&DAT_0019eb10)[(long)local_1068];
            do {
              uVar5 = frameCount - local_1058;
              ma_data_converter_get_required_input_frame_count(local_1050,uVar5,&local_1040);
              local_1068 = pFramesOut;
              if (local_1040 == 0) {
                local_1060 = 0;
                local_1038[0] = local_1038[0] & 0xffffffffffffff00;
LAB_001725a4:
                local_1048 = uVar5;
                mVar3 = ma_data_converter_process_pcm_frames
                                  (local_1050,local_1038,&local_1060,pFramesOut,&local_1048);
                if (mVar3 == MA_SUCCESS) {
                  local_1058 = local_1058 + local_1048;
                  if (pFramesOut == (void *)0x0) {
                    local_1068 = (void *)0x0;
                  }
                  else {
                    local_1068 = (void *)((long)pFramesOut +
                                         ((&DAT_0019eb10)[pDecoder->outputFormat] *
                                         pDecoder->outputChannels) * local_1048);
                  }
                  bVar6 = local_1048 != 0 || local_1060 != 0;
                  mVar3 = MA_SUCCESS;
                }
                else {
                  bVar6 = false;
                }
              }
              else {
                bVar6 = false;
                uVar2 = 0x1000 / (ulong)(uint)(local_106c * iVar1);
                frameCount_00 = uVar5;
                if (uVar2 <= uVar5) {
                  frameCount_00 = uVar2;
                }
                if (local_1040 <= frameCount_00) {
                  frameCount_00 = local_1040;
                }
                mVar3 = ma_data_source_read_pcm_frames
                                  (pDecoder->pBackend,local_1038,frameCount_00,&local_1060);
                if ((mVar3 == MA_AT_END) || (mVar3 == MA_SUCCESS)) goto LAB_001725a4;
              }
            } while ((bVar6) && (pFramesOut = local_1068, local_1058 < frameCount));
          }
        }
        else {
          pFramesRead_00 = &pDecoder->inputCacheRemaining;
          mVar3 = MA_SUCCESS;
          do {
            uVar5 = frameCount - local_1058;
            if (frameCount < local_1058 || uVar5 == 0) break;
            uVar2 = *pFramesRead_00;
            if (uVar2 == 0) {
LAB_001724bd:
              bVar6 = true;
              if (*pFramesRead_00 == 0) {
                pDecoder->inputCacheConsumed = 0;
                mVar3 = ma_data_source_read_pcm_frames
                                  (pDecoder->pBackend,pDecoder->pInputCache,pDecoder->inputCacheCap,
                                   pFramesRead_00);
                bVar6 = mVar3 == MA_SUCCESS;
              }
            }
            else {
              local_1038[0] = uVar2;
              if (uVar5 < uVar2) {
                local_1038[0] = uVar5;
              }
              local_1060 = uVar5;
              mVar3 = ma_data_converter_process_pcm_frames
                                (local_1050,
                                 (void *)((ulong)(uint)((&DAT_0019eb10)[(long)local_1068] *
                                                       local_106c) * pDecoder->inputCacheConsumed +
                                         (long)pDecoder->pInputCache),local_1038,pFramesOut,
                                 &local_1060);
              if (mVar3 == MA_SUCCESS) {
                pDecoder->inputCacheConsumed = pDecoder->inputCacheConsumed + local_1038[0];
                pDecoder->inputCacheRemaining = pDecoder->inputCacheRemaining - local_1038[0];
                local_1058 = local_1058 + local_1060;
                if (pFramesOut == (void *)0x0) {
                  pFramesOut = (void *)0x0;
                }
                else {
                  pFramesOut = (void *)((long)pFramesOut +
                                       ((&DAT_0019eb10)[pDecoder->outputFormat] *
                                       pDecoder->outputChannels) * local_1060);
                }
                mVar3 = MA_SUCCESS;
                bVar6 = false;
                if (local_1038[0] != 0 || local_1060 != 0) goto LAB_001724bd;
              }
              else {
                bVar6 = false;
              }
            }
          } while (bVar6);
        }
      }
      if (mVar4 != MA_SUCCESS) {
        return mVar4;
      }
      goto LAB_00172304;
    }
    pFramesOut = (void *)0x0;
  }
  mVar3 = ma_data_source_read_pcm_frames(pDataSource,pFramesOut,frameCount,&local_1058);
LAB_00172304:
  pDecoder->readPointerInPCMFrames = pDecoder->readPointerInPCMFrames + local_1058;
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = local_1058;
  }
  mVar4 = MA_AT_END;
  if (local_1058 != 0) {
    mVar4 = mVar3;
  }
  if (mVar3 != MA_SUCCESS) {
    mVar4 = mVar3;
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_decoder_read_pcm_frames(ma_decoder* pDecoder, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesReadOut;
    void* pRunningFramesOut;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;   /* Safety. */
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend == NULL) {
        return MA_INVALID_OPERATION;
    }

    /* Fast path. */
    if (pDecoder->converter.isPassthrough) {
        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pFramesOut, frameCount, &totalFramesReadOut);
    } else {
        /*
        Getting here means we need to do data conversion. If we're seeking forward and are _not_ doing resampling we can run this in a fast path. If we're doing resampling we
        need to run through each sample because we need to ensure its internal cache is updated.
        */
        if (pFramesOut == NULL && pDecoder->converter.hasResampler == MA_FALSE) {
            result = ma_data_source_read_pcm_frames(pDecoder->pBackend, NULL, frameCount, &totalFramesReadOut);
        } else {
            /* Slow path. Need to run everything through the data converter. */
            ma_format internalFormat;
            ma_uint32 internalChannels;

            totalFramesReadOut = 0;
            pRunningFramesOut  = pFramesOut;

            result = ma_data_source_get_data_format(pDecoder->pBackend, &internalFormat, &internalChannels, NULL, NULL, 0);
            if (result != MA_SUCCESS) {
                return result;   /* Failed to retrieve the internal format and channel count. */
            }

            /*
            We run a different path depending on whether or not we are using a heap-allocated
            intermediary buffer or not. If the data converter does not support the calculation of
            the required number of input frames, we'll use the heap-allocated path. Otherwise we'll
            use the stack-allocated path.
            */
            if (pDecoder->pInputCache != NULL) {
                /* We don't have a way of determining the required number of input frames, so need to persistently store input data in a cache. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;

                    /* If there's any data available in the cache, that needs to get processed first. */
                    if (pDecoder->inputCacheRemaining > 0) {
                        framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                        framesToReadThisIterationIn  = framesToReadThisIterationOut;
                        if (framesToReadThisIterationIn > pDecoder->inputCacheRemaining) {
                            framesToReadThisIterationIn = pDecoder->inputCacheRemaining;
                        }

                        result = ma_data_converter_process_pcm_frames(&pDecoder->converter, ma_offset_pcm_frames_ptr(pDecoder->pInputCache, pDecoder->inputCacheConsumed, internalFormat, internalChannels), &framesToReadThisIterationIn, pRunningFramesOut, &framesToReadThisIterationOut);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        pDecoder->inputCacheConsumed  += framesToReadThisIterationIn;
                        pDecoder->inputCacheRemaining -= framesToReadThisIterationIn;

                        totalFramesReadOut += framesToReadThisIterationOut;

                        if (pRunningFramesOut != NULL) {
                            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesToReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                        }

                        if (framesToReadThisIterationIn == 0 && framesToReadThisIterationOut == 0) {
                            break;  /* We're done. */
                        }
                    }

                    /* Getting here means there's no data in the cache and we need to fill it up from the data source. */
                    if (pDecoder->inputCacheRemaining == 0) {
                        pDecoder->inputCacheConsumed = 0;

                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pDecoder->pInputCache, pDecoder->inputCacheCap, &pDecoder->inputCacheRemaining);
                        if (result != MA_SUCCESS) {
                            break;
                        }
                    }
                }
            } else {
                /* We have a way of determining the required number of input frames so just use the stack. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint8 pIntermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In internal format. */
                    ma_uint64 intermediaryBufferCap = sizeof(pIntermediaryBuffer) / ma_get_bytes_per_frame(internalFormat, internalChannels);
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;
                    ma_uint64 framesReadThisIterationOut;
                    ma_uint64 requiredInputFrameCount;

                    framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                    framesToReadThisIterationIn = framesToReadThisIterationOut;
                    if (framesToReadThisIterationIn > intermediaryBufferCap) {
                        framesToReadThisIterationIn = intermediaryBufferCap;
                    }

                    ma_data_converter_get_required_input_frame_count(&pDecoder->converter, framesToReadThisIterationOut, &requiredInputFrameCount);
                    if (framesToReadThisIterationIn > requiredInputFrameCount) {
                        framesToReadThisIterationIn = requiredInputFrameCount;
                    }

                    if (requiredInputFrameCount > 0) {
                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pIntermediaryBuffer, framesToReadThisIterationIn, &framesReadThisIterationIn);

                        /*
                        Note here that even if we've reached the end, we don't want to abort because there might be more output frames needing to be
                        generated from cached input data, which might happen if resampling is being performed.
                        */
                        if (result != MA_SUCCESS && result != MA_AT_END) {
                            break;
                        }
                    } else {
                        framesReadThisIterationIn = 0;
                        pIntermediaryBuffer[0] = 0; /* <-- This is just to silence a static analysis warning. */
                    }

                    /*
                    At this point we have our decoded data in input format and now we need to convert to output format. Note that even if we didn't read any
                    input frames, we still want to try processing frames because there may some output frames generated from cached input data.
                    */
                    framesReadThisIterationOut = framesToReadThisIterationOut;
                    result = ma_data_converter_process_pcm_frames(&pDecoder->converter, pIntermediaryBuffer, &framesReadThisIterationIn, pRunningFramesOut, &framesReadThisIterationOut);
                    if (result != MA_SUCCESS) {
                        break;
                    }

                    totalFramesReadOut += framesReadThisIterationOut;

                    if (pRunningFramesOut != NULL) {
                        pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                    }

                    if (framesReadThisIterationIn == 0 && framesReadThisIterationOut == 0) {
                        break;  /* We're done. */
                    }
                }
            }
        }
    }

    pDecoder->readPointerInPCMFrames += totalFramesReadOut;

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesReadOut;
    }

    if (result == MA_SUCCESS && totalFramesReadOut == 0) {
        result =  MA_AT_END;
    }

    return result;
}